

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::Renderer_OGL10::DisplayFrame(Renderer_OGL10 *this)

{
  Renderer_OGL10 *this_local;
  
  glXSwapBuffers(this->olc_Display,*this->olc_Window);
  return;
}

Assistant:

void DisplayFrame() override
		{
#if defined(OLC_PLATFORM_WINAPI)
			SwapBuffers(glDeviceContext);
			if (bSync)
				DwmFlush(); // Woooohooooooo!!!! SMOOOOOOOTH!
#endif

#if defined(OLC_PLATFORM_X11)
			X11::glXSwapBuffers(olc_Display, *olc_Window);
#endif

#if defined(OLC_PLATFORM_GLUT)
			glutSwapBuffers();
#endif
		}